

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

string * gflags::anon_unknown_2::GetLongFlagLine
                   (string *__return_storage_ptr__,string *line_indentation,
                   CommandLineFlagInfo *info)

{
  int iVar1;
  ulong uVar2;
  string *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_type __n;
  int missing_spaces;
  int newline_pos;
  size_type newline;
  string local_118 [32];
  ulong local_f8;
  size_type newlines;
  string local_e8;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  string old_flagname;
  CommandLineFlagInfo *info_local;
  string *line_indentation_local;
  string *output;
  
  old_flagname.field_2._M_local_buf[0xf] = '\0';
  DescribeOneFlag_abi_cxx11_(__return_storage_ptr__,(gflags *)info,info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,"-",
                 &info->name);
  uVar2 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)local_48);
  psVar3 = (string *)std::__cxx11::string::size();
  std::operator+(&local_78,"-",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,psVar3);
  std::__cxx11::string::~string((string *)&local_78);
  uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x15a524);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_98,"\n    ",&local_99);
  std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(string *)0x1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x15a52b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"\n    ",&local_c1);
  std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(string *)0x1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  uVar6 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_
            (&local_e8,"%s Details for \'--%s\':\n%s    defined: %s",uVar4,uVar5,uVar6,uVar7);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if ((anonymous_namespace)::
      GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)::
      line_of_spaces_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)
                                 ::line_of_spaces_abi_cxx11_);
    if (iVar1 != 0) {
      __n = (size_type)fLI::FLAGS_tab_completion_columns;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &(anonymous_namespace)::
                  GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)::
                  line_of_spaces_abi_cxx11_,__n,' ',(allocator<char> *)((long)&newlines + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&newlines + 7));
      __cxa_atexit(std::__cxx11::string::~string,
                   &(anonymous_namespace)::
                    GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)
                    ::line_of_spaces_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)
                           ::line_of_spaces_abi_cxx11_);
    }
  }
  local_f8 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x15a579);
  while (uVar2 = local_f8, local_f8 != 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_118,"\n",(allocator<char> *)((long)&newline + 7));
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(string *)0x7);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&newline + 7));
    local_f8 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x15a579);
  }
  _missing_spaces = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  while (_missing_spaces != 0xffffffffffffffff) {
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,_missing_spaces,(string *)0x1,0x17dc18,1);
    _missing_spaces = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  }
  old_flagname.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_48);
  if ((old_flagname.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static string GetLongFlagLine(
    const string &line_indentation,
    const CommandLineFlagInfo &info) {

  string output = DescribeOneFlag(info);

  // Replace '-' with '--', and remove trailing newline before appending
  // the module definition location.
  string old_flagname = "-" + info.name;
  output.replace(
      output.find(old_flagname),
      old_flagname.size(),
      "-" + old_flagname);
  // Stick a newline and indentation in front of the type and default
  // portions of DescribeOneFlag()s description
  static const char kNewlineWithIndent[] = "\n    ";
  output.replace(output.find(" type:"), 1, string(kNewlineWithIndent));
  output.replace(output.find(" default:"), 1, string(kNewlineWithIndent));
  output = StringPrintf("%s Details for '--%s':\n"
                        "%s    defined: %s",
                        line_indentation.c_str(),
                        info.name.c_str(),
                        output.c_str(),
                        info.filename.c_str());

  // Eliminate any doubled newlines that crept in.  Specifically, if
  // DescribeOneFlag() decided to break the line just before "type"
  // or "default", we don't want to introduce an extra blank line
  static const string line_of_spaces(FLAGS_tab_completion_columns, ' ');
  static const char kDoubledNewlines[] = "\n     \n";
  for (string::size_type newlines = output.find(kDoubledNewlines);
      newlines != string::npos;
      newlines = output.find(kDoubledNewlines))
    // Replace each 'doubled newline' with a single newline
    output.replace(newlines, sizeof(kDoubledNewlines) - 1, string("\n"));

  for (string::size_type newline = output.find('\n');
      newline != string::npos;
      newline = output.find('\n')) {
    int newline_pos = static_cast<int>(newline) % FLAGS_tab_completion_columns;
    int missing_spaces = FLAGS_tab_completion_columns - newline_pos;
    output.replace(newline, 1, line_of_spaces, 1, missing_spaces);
  }
  return output;
}